

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector4 Vector4Max(Vector4 v1,Vector4 v2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2 = maxps((undefined1  [16])v2,(undefined1  [16])v1);
  auVar1._0_4_ = ~-(uint)NAN(v1.x) & auVar2._0_4_;
  auVar1._4_4_ = ~-(uint)NAN(v1.y) & auVar2._4_4_;
  auVar1._8_4_ = ~-(uint)NAN(v1.z) & auVar2._8_4_;
  auVar1._12_4_ = ~-(uint)NAN(v1.w) & auVar2._12_4_;
  auVar2._4_4_ = (uint)v2.y & -(uint)NAN(v1.y);
  auVar2._0_4_ = (uint)v2.x & -(uint)NAN(v1.x);
  auVar2._8_4_ = (uint)v2.z & -(uint)NAN(v1.z);
  auVar2._12_4_ = (uint)v2.w & -(uint)NAN(v1.w);
  return (Vector4)(auVar1 | auVar2);
}

Assistant:

RMAPI Vector4 Vector4Max(Vector4 v1, Vector4 v2)
{
    Vector4 result = { 0 };

    result.x = fmaxf(v1.x, v2.x);
    result.y = fmaxf(v1.y, v2.y);
    result.z = fmaxf(v1.z, v2.z);
    result.w = fmaxf(v1.w, v2.w);

    return result;
}